

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

void Abc_NtkFraigStoreCheck(Abc_Ntk_t *pFraig)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong local_50;
  
  iVar4 = pFraig->vPos->nSize;
  uVar3 = Abc_FrameReadStoreSize();
  uVar8 = (long)iVar4 / (long)(int)uVar3;
  if (iVar4 % (int)uVar3 != 0) {
    __assert_fail("nPoFinal % nStored == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                  ,0x31c,"void Abc_NtkFraigStoreCheck(Abc_Ntk_t *)");
  }
  iVar4 = (int)uVar8;
  if (0 < iVar4) {
    uVar8 = uVar8 & 0xffffffff;
    uVar5 = 0;
    local_50 = uVar8;
    do {
      if ((long)pFraig->vPos->nSize <= (long)uVar5) {
LAB_002580f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (1 < (int)uVar3) {
        plVar1 = (long *)pFraig->vPos->pArray[uVar5];
        lVar2 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
        uVar6 = 1;
        uVar10 = uVar5 & 0xffffffff;
        uVar7 = local_50;
        do {
          if ((int)uVar7 < 0) goto LAB_002580f0;
          uVar9 = (int)uVar10 + iVar4;
          uVar10 = (ulong)uVar9;
          if (pFraig->vPos->nSize <= (int)uVar9) goto LAB_002580f0;
          plVar1 = (long *)pFraig->vPos->pArray[uVar7];
          if (lVar2 != *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[4] * 8)) {
            printf("Verification for PO #%d of network #%d has failed. The PO function is not used.\n"
                   ,(ulong)((int)uVar5 + 1),(ulong)((int)uVar6 + 1));
          }
          uVar7 = uVar7 + uVar8;
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      uVar5 = uVar5 + 1;
      local_50 = local_50 + 1;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void Abc_NtkFraigStoreCheck( Abc_Ntk_t * pFraig )
{
    Abc_Obj_t * pNode0, * pNode1;
    int nPoOrig, nPoFinal, nStored; 
    int i, k;
    // check that the PO functions are correct
    nPoFinal = Abc_NtkPoNum(pFraig);
    nStored  = Abc_FrameReadStoreSize();
    assert( nPoFinal % nStored == 0 );
    nPoOrig  = nPoFinal / nStored;
    for ( i = 0; i < nPoOrig; i++ )
    {
        pNode0 = Abc_ObjFanin0( Abc_NtkPo(pFraig, i) ); 
        for ( k = 1; k < nStored; k++ )
        {
            pNode1 = Abc_ObjFanin0( Abc_NtkPo(pFraig, k*nPoOrig+i) ); 
            if ( pNode0 != pNode1 )
                printf( "Verification for PO #%d of network #%d has failed. The PO function is not used.\n", i+1, k+1 );
        }
    }
}